

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O1

void __thiscall pg::TLSolver::attractVertices(TLSolver *this,int pl,int v,bitset *R,bitset *Z)

{
  Game *pGVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ostream *poVar6;
  long lVar7;
  uint uVar8;
  int *piVar9;
  char *pcVar10;
  uint uVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  _label_vertex local_48;
  uint64_t *local_38;
  
  pGVar1 = (this->super_Solver).game;
  piVar9 = pGVar1->_inedges;
  iVar13 = pGVar1->_firstins[v];
  uVar8 = piVar9[iVar13];
  if (uVar8 != 0xffffffff) {
    piVar9 = piVar9 + iVar13;
    do {
      uVar5 = (ulong)(int)uVar8;
      puVar2 = Z->_bits;
      uVar14 = uVar5 >> 6;
      uVar15 = 1L << (uVar5 & 0x3f);
      uVar3 = puVar2[uVar14];
      if ((uVar3 >> (uVar5 & 0x3f) & 1) == 0) {
        if ((R->_bits[uVar14] & uVar15) != 0) {
          pGVar1 = (this->super_Solver).game;
          puVar4 = (pGVar1->_owner)._bits;
          if ((uint)((puVar4[uVar14] & uVar15) != 0) != pl) {
            uVar11 = this->escs[uVar5];
            if (uVar11 == 0) {
              iVar13 = pGVar1->_outedges[pGVar1->_firstouts[uVar5]];
              if (iVar13 == -1) {
                uVar11 = 0;
              }
              else {
                piVar12 = pGVar1->_outedges + (long)pGVar1->_firstouts[uVar5] + 1;
                uVar11 = 0;
                do {
                  uVar11 = uVar11 + (((this->G)._bits[(ulong)(long)iVar13 >> 6] >>
                                      ((long)iVar13 & 0x3fU) & 1) != 0);
                  iVar13 = *piVar12;
                  piVar12 = piVar12 + 1;
                } while (iVar13 != -1);
              }
            }
            this->escs[uVar5] = uVar11 - 1;
            local_38 = puVar4;
            if (uVar11 - 1 != 0) goto LAB_00175c4b;
          }
          puVar2[uVar14] = uVar3 | uVar15;
          iVar13 = -1;
          if ((uint)((puVar4[uVar14] & uVar15) != 0) == pl) {
            iVar13 = v;
          }
          this->str[uVar5] = iVar13;
          iVar13 = (this->Q).pointer;
          (this->Q).pointer = iVar13 + 1;
          (this->Q).queue[iVar13] = uVar8;
          if (2 < (this->super_Solver).trace) {
            poVar6 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_48.g = (this->super_Solver).game;
            local_48.v = uVar8;
            poVar6 = operator<<(poVar6,&local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m by \x1b[1;36m",0xe);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m",3);
            poVar6 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar14] & uVar15) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," (via ",6);
              local_48.g = (this->super_Solver).game;
              local_48.v = v;
              poVar6 = operator<<(poVar6,&local_48);
              lVar7 = 1;
              pcVar10 = ")";
            }
            else {
              lVar7 = 9;
              pcVar10 = " (forced)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar7);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar14] & uVar15) != 0) == pl)
              && (this->str[uVar5] == -1)) {
        this->str[uVar5] = v;
      }
LAB_00175c4b:
      uVar8 = piVar9[1];
      piVar9 = piVar9 + 1;
    } while (uVar8 != 0xffffffff);
  }
  return;
}

Assistant:

void
TLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from]) {
            if (owner(from) != pl) {
                // check if opponent can escape
                unsigned int e = escs[from];
                if (e == 0) {
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        if (G[*curedge]) e++;
                    }
                }
                escs[from] = --e;
                if (e > 0) continue; // escapes
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}